

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O3

void duckdb::FilterSelectionSwitch<long>
               (UnifiedVectorFormat *vdata,long predicate,SelectionVector *sel,
               idx_t *approved_tuple_count,ExpressionType comparison_type)

{
  unsigned_long *puVar1;
  idx_t iVar2;
  sel_t *psVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  long lVar6;
  idx_t iVar7;
  NotImplementedException *this;
  undefined7 in_register_00000081;
  idx_t iVar8;
  idx_t iVar9;
  idx_t iVar10;
  ulong uVar11;
  SelectionVector new_sel;
  SelectionVector local_68;
  string local_50;
  
  SelectionVector::SelectionVector(&local_68,*approved_tuple_count);
  switch((int)CONCAT71(in_register_00000081,comparison_type)) {
  case 0x19:
    puVar1 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar2 = *approved_tuple_count;
    if (puVar1 == (unsigned_long *)0x0) {
      if (iVar2 != 0) {
        pdVar4 = vdata->data;
        psVar3 = sel->sel_vector;
        psVar5 = vdata->sel->sel_vector;
        iVar7 = 0;
        iVar8 = 0;
        do {
          iVar9 = iVar8;
          if (psVar3 != (sel_t *)0x0) {
            iVar9 = (idx_t)psVar3[iVar8];
          }
          iVar10 = iVar9;
          if (psVar5 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar5[iVar9];
          }
          lVar6 = *(long *)(pdVar4 + iVar10 * 8);
          local_68.sel_vector[iVar7] = (sel_t)iVar9;
          iVar7 = iVar7 + (lVar6 == predicate);
          iVar8 = iVar8 + 1;
        } while (iVar2 != iVar8);
        goto LAB_0060713d;
      }
    }
    else if (iVar2 != 0) {
      psVar3 = sel->sel_vector;
      pdVar4 = vdata->data;
      psVar5 = vdata->sel->sel_vector;
      iVar7 = 0;
      iVar8 = 0;
      do {
        iVar9 = iVar8;
        if (psVar3 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar3[iVar8];
        }
        iVar10 = iVar9;
        if (psVar5 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar5[iVar9];
        }
        if ((puVar1[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)(*(long *)(pdVar4 + iVar10 * 8) == predicate);
        }
        local_68.sel_vector[iVar7] = (sel_t)iVar9;
        iVar7 = iVar7 + uVar11;
        iVar8 = iVar8 + 1;
      } while (iVar2 != iVar8);
      goto LAB_0060713d;
    }
    break;
  case 0x1a:
    puVar1 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar2 = *approved_tuple_count;
    if (puVar1 == (unsigned_long *)0x0) {
      if (iVar2 != 0) {
        pdVar4 = vdata->data;
        psVar3 = sel->sel_vector;
        psVar5 = vdata->sel->sel_vector;
        iVar7 = 0;
        iVar8 = 0;
        do {
          iVar9 = iVar8;
          if (psVar3 != (sel_t *)0x0) {
            iVar9 = (idx_t)psVar3[iVar8];
          }
          iVar10 = iVar9;
          if (psVar5 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar5[iVar9];
          }
          lVar6 = *(long *)(pdVar4 + iVar10 * 8);
          local_68.sel_vector[iVar7] = (sel_t)iVar9;
          iVar7 = iVar7 + (lVar6 != predicate);
          iVar8 = iVar8 + 1;
        } while (iVar2 != iVar8);
        goto LAB_0060713d;
      }
    }
    else if (iVar2 != 0) {
      psVar3 = sel->sel_vector;
      pdVar4 = vdata->data;
      psVar5 = vdata->sel->sel_vector;
      iVar7 = 0;
      iVar8 = 0;
      do {
        iVar9 = iVar8;
        if (psVar3 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar3[iVar8];
        }
        iVar10 = iVar9;
        if (psVar5 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar5[iVar9];
        }
        if ((puVar1[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)(*(long *)(pdVar4 + iVar10 * 8) != predicate);
        }
        local_68.sel_vector[iVar7] = (sel_t)iVar9;
        iVar7 = iVar7 + uVar11;
        iVar8 = iVar8 + 1;
      } while (iVar2 != iVar8);
      goto LAB_0060713d;
    }
    break;
  case 0x1b:
    puVar1 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar2 = *approved_tuple_count;
    if (puVar1 == (unsigned_long *)0x0) {
      if (iVar2 != 0) {
        pdVar4 = vdata->data;
        psVar3 = sel->sel_vector;
        psVar5 = vdata->sel->sel_vector;
        iVar7 = 0;
        iVar8 = 0;
        do {
          iVar9 = iVar8;
          if (psVar3 != (sel_t *)0x0) {
            iVar9 = (idx_t)psVar3[iVar8];
          }
          iVar10 = iVar9;
          if (psVar5 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar5[iVar9];
          }
          lVar6 = *(long *)(pdVar4 + iVar10 * 8);
          local_68.sel_vector[iVar7] = (sel_t)iVar9;
          iVar7 = iVar7 + (lVar6 < predicate);
          iVar8 = iVar8 + 1;
        } while (iVar2 != iVar8);
        goto LAB_0060713d;
      }
    }
    else if (iVar2 != 0) {
      psVar3 = sel->sel_vector;
      pdVar4 = vdata->data;
      psVar5 = vdata->sel->sel_vector;
      iVar7 = 0;
      iVar8 = 0;
      do {
        iVar9 = iVar8;
        if (psVar3 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar3[iVar8];
        }
        iVar10 = iVar9;
        if (psVar5 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar5[iVar9];
        }
        if ((puVar1[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)(*(long *)(pdVar4 + iVar10 * 8) < predicate);
        }
        local_68.sel_vector[iVar7] = (sel_t)iVar9;
        iVar7 = iVar7 + uVar11;
        iVar8 = iVar8 + 1;
      } while (iVar2 != iVar8);
      goto LAB_0060713d;
    }
    break;
  case 0x1c:
    puVar1 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar2 = *approved_tuple_count;
    if (puVar1 == (unsigned_long *)0x0) {
      if (iVar2 != 0) {
        pdVar4 = vdata->data;
        psVar3 = sel->sel_vector;
        psVar5 = vdata->sel->sel_vector;
        iVar7 = 0;
        iVar8 = 0;
        do {
          iVar9 = iVar8;
          if (psVar3 != (sel_t *)0x0) {
            iVar9 = (idx_t)psVar3[iVar8];
          }
          iVar10 = iVar9;
          if (psVar5 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar5[iVar9];
          }
          lVar6 = *(long *)(pdVar4 + iVar10 * 8);
          local_68.sel_vector[iVar7] = (sel_t)iVar9;
          iVar7 = iVar7 + (predicate < lVar6);
          iVar8 = iVar8 + 1;
        } while (iVar2 != iVar8);
        goto LAB_0060713d;
      }
    }
    else if (iVar2 != 0) {
      psVar3 = sel->sel_vector;
      pdVar4 = vdata->data;
      psVar5 = vdata->sel->sel_vector;
      iVar7 = 0;
      iVar8 = 0;
      do {
        iVar9 = iVar8;
        if (psVar3 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar3[iVar8];
        }
        iVar10 = iVar9;
        if (psVar5 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar5[iVar9];
        }
        if ((puVar1[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)(predicate < *(long *)(pdVar4 + iVar10 * 8));
        }
        local_68.sel_vector[iVar7] = (sel_t)iVar9;
        iVar7 = iVar7 + uVar11;
        iVar8 = iVar8 + 1;
      } while (iVar2 != iVar8);
      goto LAB_0060713d;
    }
    break;
  case 0x1d:
    puVar1 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar2 = *approved_tuple_count;
    if (puVar1 == (unsigned_long *)0x0) {
      if (iVar2 != 0) {
        pdVar4 = vdata->data;
        psVar3 = sel->sel_vector;
        psVar5 = vdata->sel->sel_vector;
        iVar7 = 0;
        iVar8 = 0;
        do {
          iVar9 = iVar8;
          if (psVar3 != (sel_t *)0x0) {
            iVar9 = (idx_t)psVar3[iVar8];
          }
          iVar10 = iVar9;
          if (psVar5 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar5[iVar9];
          }
          lVar6 = *(long *)(pdVar4 + iVar10 * 8);
          local_68.sel_vector[iVar7] = (sel_t)iVar9;
          iVar7 = iVar7 + (lVar6 <= predicate);
          iVar8 = iVar8 + 1;
        } while (iVar2 != iVar8);
        goto LAB_0060713d;
      }
    }
    else if (iVar2 != 0) {
      psVar3 = sel->sel_vector;
      pdVar4 = vdata->data;
      psVar5 = vdata->sel->sel_vector;
      iVar7 = 0;
      iVar8 = 0;
      do {
        iVar9 = iVar8;
        if (psVar3 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar3[iVar8];
        }
        iVar10 = iVar9;
        if (psVar5 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar5[iVar9];
        }
        if ((puVar1[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)(*(long *)(pdVar4 + iVar10 * 8) <= predicate);
        }
        local_68.sel_vector[iVar7] = (sel_t)iVar9;
        iVar7 = iVar7 + uVar11;
        iVar8 = iVar8 + 1;
      } while (iVar2 != iVar8);
      goto LAB_0060713d;
    }
    break;
  case 0x1e:
    puVar1 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    iVar2 = *approved_tuple_count;
    if (puVar1 == (unsigned_long *)0x0) {
      if (iVar2 != 0) {
        pdVar4 = vdata->data;
        psVar3 = sel->sel_vector;
        psVar5 = vdata->sel->sel_vector;
        iVar7 = 0;
        iVar8 = 0;
        do {
          iVar9 = iVar8;
          if (psVar3 != (sel_t *)0x0) {
            iVar9 = (idx_t)psVar3[iVar8];
          }
          iVar10 = iVar9;
          if (psVar5 != (sel_t *)0x0) {
            iVar10 = (idx_t)psVar5[iVar9];
          }
          lVar6 = *(long *)(pdVar4 + iVar10 * 8);
          local_68.sel_vector[iVar7] = (sel_t)iVar9;
          iVar7 = iVar7 + (predicate <= lVar6);
          iVar8 = iVar8 + 1;
        } while (iVar2 != iVar8);
        goto LAB_0060713d;
      }
    }
    else if (iVar2 != 0) {
      psVar3 = sel->sel_vector;
      pdVar4 = vdata->data;
      psVar5 = vdata->sel->sel_vector;
      iVar7 = 0;
      iVar8 = 0;
      do {
        iVar9 = iVar8;
        if (psVar3 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar3[iVar8];
        }
        iVar10 = iVar9;
        if (psVar5 != (sel_t *)0x0) {
          iVar10 = (idx_t)psVar5[iVar9];
        }
        if ((puVar1[iVar10 >> 6] >> (iVar10 & 0x3f) & 1) == 0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)(predicate <= *(long *)(pdVar4 + iVar10 * 8));
        }
        local_68.sel_vector[iVar7] = (sel_t)iVar9;
        iVar7 = iVar7 + uVar11;
        iVar8 = iVar8 + 1;
      } while (iVar2 != iVar8);
      goto LAB_0060713d;
    }
    break;
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Unknown comparison type for filter pushed down to table!","");
    NotImplementedException::NotImplementedException(this,&local_50);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar7 = 0;
LAB_0060713d:
  *approved_tuple_count = iVar7;
  shared_ptr<duckdb::SelectionData,_true>::operator=(&sel->selection_data,&local_68.selection_data);
  sel->sel_vector = local_68.sel_vector;
  if (local_68.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

static void FilterSelectionSwitch(UnifiedVectorFormat &vdata, T predicate, SelectionVector &sel,
                                  idx_t &approved_tuple_count, ExpressionType comparison_type) {
	SelectionVector new_sel(approved_tuple_count);
	auto &mask = vdata.validity;
	// the inplace loops take the result as the last parameter
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, Equals, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, Equals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_NOTEQUAL: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, NotEquals, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, NotEquals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_LESSTHAN: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThan, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThan, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_GREATERTHAN: {
		if (mask.AllValid()) {
			approved_tuple_count =
			    TemplatedFilterSelection<T, GreaterThan, false>(vdata, predicate, sel, approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, GreaterThan, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_LESSTHANOREQUALTO: {
		if (mask.AllValid()) {
			approved_tuple_count = TemplatedFilterSelection<T, LessThanEquals, false>(vdata, predicate, sel,
			                                                                          approved_tuple_count, new_sel);
		} else {
			approved_tuple_count =
			    TemplatedFilterSelection<T, LessThanEquals, true>(vdata, predicate, sel, approved_tuple_count, new_sel);
		}
		break;
	}
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO: {
		if (mask.AllValid()) {
			approved_tuple_count = TemplatedFilterSelection<T, GreaterThanEquals, false>(vdata, predicate, sel,
			                                                                             approved_tuple_count, new_sel);
		} else {
			approved_tuple_count = TemplatedFilterSelection<T, GreaterThanEquals, true>(vdata, predicate, sel,
			                                                                            approved_tuple_count, new_sel);
		}
		break;
	}
	default:
		throw NotImplementedException("Unknown comparison type for filter pushed down to table!");
	}
	sel.Initialize(new_sel);
}